

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_alpha_mask_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_image alpha_mask,void *dst,
          rf_int dst_size)

{
  long lVar1;
  rf_source_location source_location;
  rf_source_location source_location_00;
  rf_source_location source_location_01;
  rf_int rVar2;
  _Bool _Var3;
  int iVar4;
  long *in_FS_OFFSET;
  undefined4 uStack_b4;
  undefined4 uStack_7c;
  undefined4 uStack_44;
  undefined1 local_21;
  long lStack_20;
  uchar mask_pixel;
  rf_int i;
  rf_int dst_size_local;
  void *dst_local;
  
  i = dst_size;
  dst_size_local = (rf_int)dst;
  memset(__return_storage_ptr__,0,0x18);
  if ((((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) ||
     (((undefined1  [24])alpha_mask & (undefined1  [24])0x100000000) == (undefined1  [24])0x0)) {
    source_location_01.proc_name = "rf_image_alpha_mask_to_buffer";
    source_location_01.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location_01.line_in_file = 0x3eda;
    rf_log_impl(source_location_01,RF_LOG_TYPE_ERROR,
                "One image was invalid. `image.valid`: %d, `alpha_mask.valid`: %d",1,
                (ulong)(image.valid & 1),(ulong)(alpha_mask.valid & 1),
                "rf_image_alpha_mask_to_buffer");
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_alpha_mask_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3eda;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_b4,1);
  }
  else if ((image.width == alpha_mask.width) && (image.height == alpha_mask.height)) {
    _Var3 = rf_is_compressed_format(image.format);
    rVar2 = i;
    if ((_Var3) && (alpha_mask.format == RF_UNCOMPRESSED_GRAYSCALE)) {
      iVar4 = rf_image_size_in_format(image,RF_UNCOMPRESSED_GRAY_ALPHA);
      if (iVar4 <= rVar2) {
        for (lStack_20 = 0; lStack_20 < image.width * image.height; lStack_20 = lStack_20 + 1) {
          local_21 = 0;
          rf_format_one_pixel((void *)((long)alpha_mask.data + lStack_20),RF_UNCOMPRESSED_GRAYSCALE,
                              &local_21,RF_UNCOMPRESSED_GRAYSCALE);
        }
        __return_storage_ptr__->data = (void *)dst_size_local;
        __return_storage_ptr__->width = image.width;
        __return_storage_ptr__->height = image.height;
        __return_storage_ptr__->format = RF_UNCOMPRESSED_GRAY_ALPHA;
        __return_storage_ptr__->valid = true;
      }
    }
    else {
      source_location.proc_name = "rf_image_alpha_mask_to_buffer";
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.line_in_file = 0x3ed8;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Expected compressed pixel formats. `image.format`: %d, `alpha_mask.format`: %d",1
                  ,(ulong)image.format,(ulong)alpha_mask.format,"rf_image_alpha_mask_to_buffer");
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_image_alpha_mask_to_buffer";
      *(undefined8 *)(lVar1 + -0x450) = 0x3ed8;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_44,1);
    }
  }
  else {
    source_location_00.proc_name = "rf_image_alpha_mask_to_buffer";
    source_location_00.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    source_location_00.line_in_file = 0x3ed9;
    rf_log_impl(source_location_00,RF_LOG_TYPE_ERROR,
                "Alpha mask must be same size as image but was w: %d, h: %d",1,
                (ulong)(uint)alpha_mask.width,(ulong)(uint)alpha_mask.height,
                "rf_image_alpha_mask_to_buffer");
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_alpha_mask_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3ed9;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_7c,1);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_alpha_mask_to_buffer(rf_image image, rf_image alpha_mask, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid && alpha_mask.valid)
    {
        if (image.width == alpha_mask.width && image.height == alpha_mask.height)
        {
            if (rf_is_compressed_format(image.format) && alpha_mask.format == RF_UNCOMPRESSED_GRAYSCALE)
            {
                if (dst_size >= rf_image_size_in_format(image, RF_UNCOMPRESSED_GRAY_ALPHA))
                {
                    // Apply alpha mask to alpha channel
                    for (rf_int i = 0; i < image.width * image.height; i++)
                    {
                        unsigned char mask_pixel = 0;
                        rf_format_one_pixel(((unsigned char*)alpha_mask.data) + i, alpha_mask.format, &mask_pixel, RF_UNCOMPRESSED_GRAYSCALE);

                        // Todo: Finish implementing this function
                        //((unsigned char*)dst)[k] = mask_pixel;
                    }

                    result.data   = dst;
                    result.width  = image.width;
                    result.height = image.height;
                    result.format = RF_UNCOMPRESSED_GRAY_ALPHA;
                    result.valid  = true;
                }
            } else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Expected compressed pixel formats. `image.format`: %d, `alpha_mask.format`: %d", image.format, alpha_mask.format);
        } else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Alpha mask must be same size as image but was w: %d, h: %d", alpha_mask.width, alpha_mask.height);
    } else RF_LOG_ERROR(RF_BAD_ARGUMENT, "One image was invalid. `image.valid`: %d, `alpha_mask.valid`: %d", image.valid, alpha_mask.valid);

    return result;
}